

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_UpdateMouseCursor(void)

{
  ImGuiMouseCursor IVar1;
  ImGuiIO *pIVar2;
  ImGuiMouseCursor imgui_cursor;
  ImGuiIO *io;
  SDL_Cursor *local_18;
  
  pIVar2 = ImGui::GetIO();
  if ((pIVar2->ConfigFlags & 0x20U) == 0) {
    IVar1 = ImGui::GetMouseCursor();
    if (((pIVar2->MouseDrawCursor & 1U) == 0) && (IVar1 != -1)) {
      if (g_MouseCursors[IVar1] == (SDL_Cursor *)0x0) {
        local_18 = g_MouseCursors[0];
      }
      else {
        local_18 = g_MouseCursors[IVar1];
      }
      SDL_SetCursor(local_18);
      SDL_ShowCursor(1);
    }
    else {
      SDL_ShowCursor(0);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateMouseCursor()
{
    ImGuiIO& io = ImGui::GetIO();
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)
        return;

    ImGuiMouseCursor imgui_cursor = ImGui::GetMouseCursor();
    if (io.MouseDrawCursor || imgui_cursor == ImGuiMouseCursor_None)
    {
        // Hide OS mouse cursor if imgui is drawing it or if it wants no cursor
        SDL_ShowCursor(SDL_FALSE);
    }
    else
    {
        // Show OS mouse cursor
        SDL_SetCursor(g_MouseCursors[imgui_cursor] ? g_MouseCursors[imgui_cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
        SDL_ShowCursor(SDL_TRUE);
    }
}